

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveErrorWarning(Parser *parser,int flags)

{
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[3]> _Var1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[4]> _Var2;
  undefined4 in_register_00000034;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  stringValue;
  pointer local_40;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  getStringOrIdentifier_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_38,(Parser *)CONCAT44(in_register_00000034,flags));
  if (local_38._M_engaged == false) {
LAB_0016d022:
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    _Var1 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_38,(char (*) [3])0x17f533);
    if (_Var1) {
      Logger::errorOnWarning = true;
      std::make_unique<DummyCommand>();
    }
    else {
      _Var2 = std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_38,(char (*) [4])"off");
      if (!_Var2) goto LAB_0016d022;
      Logger::errorOnWarning = false;
      std::make_unique<DummyCommand>();
    }
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = local_40;
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveErrorWarning(Parser& parser, int flags)
{
	auto stringValue = getStringOrIdentifier(parser);
	if (!stringValue)
		return nullptr;

	if (stringValue == "on")
	{	
		Logger::setErrorOnWarning(true);
		return std::make_unique<DummyCommand>();
	} else if (stringValue == "off")
	{
		Logger::setErrorOnWarning(false);
		return std::make_unique<DummyCommand>();
	}

	return nullptr;
}